

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringsTest.cc
# Opt level: O3

void print_data_test_case<char_const*,long,char_const*,int>
               (string *expected_output,char *args,long args_1,char *args_2,int args_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  size_type stream;
  int iVar3;
  _Alloc_hider _Var4;
  string output_data;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  uint64_t local_60;
  char *local_58;
  string local_50;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_60 = args_1;
  local_58 = args_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"StringsTest-data","");
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"w","");
  phosg::fopen_unique((phosg *)&local_50,&local_a8,&local_80,(FILE *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  stream = local_50._M_string_length;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,args,(allocator<char> *)&local_80);
  phosg::print_data((FILE *)stream,(string *)&local_a8,local_60,local_58,(long)args_3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((FILE *)local_50._M_string_length != (FILE *)0x0) {
    (*(code *)local_50._M_dataplus._M_p)();
  }
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"StringsTest-data","");
  phosg::load_file(&local_a8,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  sVar2 = expected_output->_M_string_length;
  if (sVar2 == local_a8._M_string_length) {
    if (sVar2 != 0) {
      iVar3 = bcmp((expected_output->_M_dataplus)._M_p,local_a8._M_dataplus._M_p,sVar2);
      if (iVar3 != 0) goto LAB_0011325e;
    }
  }
  else {
LAB_0011325e:
    fputs("(print_data) Expected:\n",_stderr);
    fwrite((expected_output->_M_dataplus)._M_p,1,expected_output->_M_string_length,_stderr);
    fputs("(print_data) Actual:\n",_stderr);
    fwrite(local_a8._M_dataplus._M_p,1,local_a8._M_string_length,_stderr);
    phosg::expect_generic
              (false,"!(false)",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
               ,0x1d);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,args,&local_81);
  phosg::format_data((string *)&local_80,&local_50,local_60,local_58,(long)args_3);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  _Var4._M_p = local_a8._M_dataplus._M_p;
  sVar2 = expected_output->_M_string_length;
  if (sVar2 == local_a8._M_string_length) {
    if (sVar2 == 0) goto LAB_00113358;
    iVar3 = bcmp((expected_output->_M_dataplus)._M_p,local_a8._M_dataplus._M_p,sVar2);
    if (iVar3 == 0) goto LAB_00113358;
  }
  fputs("(format_data) Expected:\n",_stderr);
  fwrite((expected_output->_M_dataplus)._M_p,1,expected_output->_M_string_length,_stderr);
  fputs("(format_data) Actual:\n",_stderr);
  fwrite(local_a8._M_dataplus._M_p,1,local_a8._M_string_length,_stderr);
  phosg::expect_generic
            (false,"!(false)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x27);
  _Var4._M_p = local_a8._M_dataplus._M_p;
LAB_00113358:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != &local_a8.field_2) {
    operator_delete(_Var4._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void print_data_test_case(const string& expected_output, ArgTs... args) {

  // macOS doesn't have fmemopen, so we just write to a file because I'm too
  // lazy to use funopen()
  {
    auto f = fopen_unique("StringsTest-data", "w");
    print_data(f.get(), args...);
  }
  string output_data = load_file("StringsTest-data");

  if (expected_output != output_data) {
    fputs("(print_data) Expected:\n", stderr);
    fwrite(expected_output.data(), 1, expected_output.size(), stderr);
    fputs("(print_data) Actual:\n", stderr);
    fwrite(output_data.data(), 1, output_data.size(), stderr);
    expect(false);
  }

  // Also test format_data - it should produce the same result
  output_data = format_data(args...);
  if (expected_output != output_data) {
    fputs("(format_data) Expected:\n", stderr);
    fwrite(expected_output.data(), 1, expected_output.size(), stderr);
    fputs("(format_data) Actual:\n", stderr);
    fwrite(output_data.data(), 1, output_data.size(), stderr);
    expect(false);
  }
}